

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_cells_aa.h
# Opt level: O0

void __thiscall
agg::rasterizer_cells_aa<agg::cell_aa>::~rasterizer_cells_aa
          (rasterizer_cells_aa<agg::cell_aa> *this)

{
  uint uVar1;
  cell_type **local_18;
  cell_type **ptr;
  rasterizer_cells_aa<agg::cell_aa> *this_local;
  
  if (this->m_num_blocks != 0) {
    local_18 = this->m_cells + this->m_num_blocks;
    while (local_18 = local_18 + -1, uVar1 = this->m_num_blocks, this->m_num_blocks = uVar1 - 1,
          uVar1 != 0) {
      pod_allocator<agg::cell_aa>::deallocate(*local_18,0x1000);
    }
    pod_allocator<agg::cell_aa_*>::deallocate(this->m_cells,this->m_max_blocks);
  }
  pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::~pod_vector(&this->m_sorted_y);
  pod_vector<agg::cell_aa_*>::~pod_vector(&this->m_sorted_cells);
  return;
}

Assistant:

rasterizer_cells_aa<Cell>::~rasterizer_cells_aa()
    {
        if(m_num_blocks)
        {
            cell_type** ptr = m_cells + m_num_blocks - 1;
            while(m_num_blocks--)
            {
                pod_allocator<cell_type>::deallocate(*ptr, cell_block_size);
                ptr--;
            }
            pod_allocator<cell_type*>::deallocate(m_cells, m_max_blocks);
        }
    }